

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timsort.h
# Opt level: O0

int libxml_domnode_tim_sort_collapse
              (xmlNodePtr *dst,TIM_SORT_RUN_T *stack,int stack_curr,TEMP_STORAGE_T *store,
              size_t size)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  bool bVar4;
  bool bVar5;
  int CD;
  int BCD;
  int ABC;
  size_t D;
  size_t C;
  size_t B;
  size_t A;
  size_t size_local;
  TEMP_STORAGE_T *store_local;
  int stack_curr_local;
  TIM_SORT_RUN_T *stack_local;
  xmlNodePtr *dst_local;
  
  store_local._4_4_ = stack_curr;
  while( true ) {
    if (store_local._4_4_ < 2) {
      return store_local._4_4_;
    }
    if ((store_local._4_4_ == 2) && (stack->length + stack[1].length == size)) {
      libxml_domnode_tim_sort_merge(dst,stack,2,store);
      stack->length = stack[1].length + stack->length;
      return 1;
    }
    if ((store_local._4_4_ == 2) && (stack->length <= stack[1].length)) {
      libxml_domnode_tim_sort_merge(dst,stack,2,store);
      stack->length = stack[1].length + stack->length;
      return 1;
    }
    if (store_local._4_4_ == 2) {
      return 2;
    }
    uVar1 = stack[store_local._4_4_ + -3].length;
    uVar2 = stack[store_local._4_4_ + -2].length;
    uVar3 = stack[store_local._4_4_ + -1].length;
    if (store_local._4_4_ < 4) {
      bVar4 = false;
    }
    else {
      bVar4 = stack[store_local._4_4_ + -4].length <= uVar1 + uVar2;
    }
    bVar5 = uVar2 + uVar3 < uVar1;
    if ((bVar5 && !bVar4) && (uVar2 > uVar3)) break;
    if ((bVar5 && !bVar4) || (uVar2 <= uVar3)) {
      libxml_domnode_tim_sort_merge(dst,stack,store_local._4_4_,store);
      stack[store_local._4_4_ + -2].length =
           stack[store_local._4_4_ + -1].length + stack[store_local._4_4_ + -2].length;
    }
    else {
      libxml_domnode_tim_sort_merge(dst,stack,store_local._4_4_ + -1,store);
      stack[store_local._4_4_ + -3].length =
           stack[store_local._4_4_ + -2].length + stack[store_local._4_4_ + -3].length;
      stack[store_local._4_4_ + -2].start = stack[store_local._4_4_ + -1].start;
      stack[store_local._4_4_ + -2].length = stack[store_local._4_4_ + -1].length;
    }
    store_local._4_4_ = store_local._4_4_ + -1;
  }
  return store_local._4_4_;
}

Assistant:

static int TIM_SORT_COLLAPSE(SORT_TYPE *dst, TIM_SORT_RUN_T *stack, int stack_curr,
                             TEMP_STORAGE_T *store, const size_t size) {
  while (1) {
    size_t A, B, C, D;
    int ABC, BCD, CD;

    /* if the stack only has one thing on it, we are done with the collapse */
    if (stack_curr <= 1) {
      break;
    }

    /* if this is the last merge, just do it */
    if ((stack_curr == 2) && (stack[0].length + stack[1].length == size)) {
      TIM_SORT_MERGE(dst, stack, stack_curr, store);
      stack[0].length += stack[1].length;
      stack_curr--;
      break;
    }
    /* check if the invariant is off for a stack of 2 elements */
    else if ((stack_curr == 2) && (stack[0].length <= stack[1].length)) {
      TIM_SORT_MERGE(dst, stack, stack_curr, store);
      stack[0].length += stack[1].length;
      stack_curr--;
      break;
    } else if (stack_curr == 2) {
      break;
    }

    B = stack[stack_curr - 3].length;
    C = stack[stack_curr - 2].length;
    D = stack[stack_curr - 1].length;

    if (stack_curr >= 4) {
      A = stack[stack_curr - 4].length;
      ABC = (A <= B + C);
    } else {
      ABC = 0;
    }

    BCD = (B <= C + D) || ABC;
    CD = (C <= D);

    /* Both invariants are good */
    if (!BCD && !CD) {
      break;
    }

    /* left merge */
    if (BCD && !CD) {
      TIM_SORT_MERGE(dst, stack, stack_curr - 1, store);
      stack[stack_curr - 3].length += stack[stack_curr - 2].length;
      stack[stack_curr - 2] = stack[stack_curr - 1];
      stack_curr--;
    } else {
      /* right merge */
      TIM_SORT_MERGE(dst, stack, stack_curr, store);
      stack[stack_curr - 2].length += stack[stack_curr - 1].length;
      stack_curr--;
    }
  }

  return stack_curr;
}